

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O0

int Abc_NtkMultiLimit_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,int nFaninMax,int fCanStop,int fFirst)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int RetValue;
  int nNodes1;
  int nNodes0;
  int fFirst_local;
  int fCanStop_local;
  int nFaninMax_local;
  Vec_Ptr_t *vCone_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                  ,0x130,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
  }
  if (fFirst == 0) {
    if ((*(uint *)&pNode->field_0x14 >> 4 & 1) == 0) {
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 != 0) goto LAB_002df7d8;
    }
    Vec_PtrPushUnique(vCone,pNode);
    pNode_local._4_4_ = 0;
  }
  else {
LAB_002df7d8:
    if (fCanStop == 0) {
      pAVar2 = Abc_ObjFanin(pNode,0);
      Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,0,0);
      pAVar2 = Abc_ObjFanin(pNode,1);
      Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,0,0);
      pNode_local._4_4_ = 0;
    }
    else {
      if (vCone->nSize != 0) {
        __assert_fail("vCone->nSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                      ,0x13f,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
      }
      pAVar2 = Abc_ObjFanin(pNode,0);
      iVar1 = Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,1,0);
      if (iVar1 == 0) {
        iVar1 = vCone->nSize;
        if (nFaninMax < iVar1) {
          __assert_fail("nNodes0 <= nFaninMax",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                        ,0x144,"int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)")
          ;
        }
        pAVar2 = Abc_ObjFanin(pNode,1);
        Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,0,0);
        if (nFaninMax < vCone->nSize) {
          vCone->nSize = 0;
          pAVar2 = Abc_ObjFanin(pNode,1);
          Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,0,0);
          if (nFaninMax < vCone->nSize) {
            vCone->nSize = 0;
            pAVar2 = Abc_ObjFanin(pNode,1);
            iVar1 = Abc_NtkMultiLimit_rec(pAVar2,vCone,nFaninMax,1,0);
            if (iVar1 != 1) {
              __assert_fail("RetValue == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                            ,0x154,
                            "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
            }
            pNode_local._4_4_ = 1;
          }
          else {
            if (nFaninMax < vCone->nSize) {
              __assert_fail("nNodes1 <= nFaninMax",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                            ,0x159,
                            "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
            }
            if (iVar1 < vCone->nSize) {
              pAVar2 = Abc_ObjFanin(pNode,1);
              if ((*(uint *)&pAVar2->field_0x14 >> 4 & 1) != 0) {
                __assert_fail("Abc_ObjFanin(pNode,1)->fMarkA == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                              ,0x161,
                              "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
              }
              pAVar2 = Abc_ObjFanin(pNode,1);
              *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
            }
            else {
              pAVar2 = Abc_ObjFanin(pNode,0);
              if ((*(uint *)&pAVar2->field_0x14 >> 4 & 1) != 0) {
                __assert_fail("Abc_ObjFanin(pNode,0)->fMarkA == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMulti.c"
                              ,0x15c,
                              "int Abc_NtkMultiLimit_rec(Abc_Obj_t *, Vec_Ptr_t *, int, int, int)");
              }
              pAVar2 = Abc_ObjFanin(pNode,0);
              *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef | 0x10;
            }
            pNode_local._4_4_ = 1;
          }
        }
        else {
          pNode_local._4_4_ = 0;
        }
      }
      else {
        pNode_local._4_4_ = 1;
      }
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkMultiLimit_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, int nFaninMax, int fCanStop, int fFirst )
{
    int nNodes0, nNodes1;
    assert( !Abc_ObjIsComplement(pNode) );
    // check if the node should be added to the fanins
    if ( !fFirst && (pNode->fMarkA || !Abc_ObjIsNode(pNode)) )
    {
        Vec_PtrPushUnique( vCone, pNode );
        return 0;
    }
    // if we cannot stop in this branch, collect all nodes
    if ( !fCanStop )
    {
        Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,0), vCone, nFaninMax, 0, 0 );
        Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
        return 0;
    }
    // if we can stop, try the left branch first, and return if we stopped
    assert( vCone->nSize == 0 );
    if ( Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,0), vCone, nFaninMax, 1, 0 ) )
        return 1;
    // save the number of nodes in the left branch and call for the right branch
    nNodes0 = vCone->nSize;
    assert( nNodes0 <= nFaninMax );
    Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
    // check the number of nodes
    if ( vCone->nSize <= nFaninMax )
        return 0;
    // the number of nodes exceeds the limit

    // get the number of nodes in the right branch
    vCone->nSize = 0;
    Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 0, 0 );
    // if this number exceeds the limit, solve the problem for this branch
    if ( vCone->nSize > nFaninMax )
    {
        int RetValue;
        vCone->nSize = 0;
        RetValue = Abc_NtkMultiLimit_rec( Abc_ObjFanin(pNode,1), vCone, nFaninMax, 1, 0 );
        assert( RetValue == 1 );
        return 1;
    }

    nNodes1 = vCone->nSize; 
    assert( nNodes1 <= nFaninMax );
    if ( nNodes0 >= nNodes1 )
    { // the left branch is larger - cut it
        assert( Abc_ObjFanin(pNode,0)->fMarkA == 0 );
        Abc_ObjFanin(pNode,0)->fMarkA = 1;
    }
    else
    { // the right branch is larger - cut it
        assert( Abc_ObjFanin(pNode,1)->fMarkA == 0 );
        Abc_ObjFanin(pNode,1)->fMarkA = 1;
    }
    return 1;
}